

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::copyGroupElements
          (TraverseSchema *this,DOMElement *elem,XercesGroupInfo *fromGroup,XercesGroupInfo *toGroup
          ,ComplexTypeInfo *typeInfo)

{
  uint newEnclosingScope;
  uint uVar1;
  int iVar2;
  SchemaElementDecl *pSVar3;
  SchemaElementDecl *this_00;
  XMLCh *text1;
  undefined4 extraout_var;
  ComplexTypeInfo *pCVar4;
  ComplexTypeInfo *pCVar5;
  DatatypeValidator *pDVar6;
  DatatypeValidator *pDVar7;
  uint local_74;
  SchemaElementDecl *other;
  XMLCh *localPart;
  int elemURI;
  uint elemScope;
  SchemaElementDecl *elemDecl;
  XMLSize_t i;
  int newScope;
  XMLSize_t elemCount;
  ComplexTypeInfo *typeInfo_local;
  XercesGroupInfo *toGroup_local;
  XercesGroupInfo *fromGroup_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  SchemaElementDecl *this_01;
  
  pSVar3 = (SchemaElementDecl *)XercesGroupInfo::elementCount(fromGroup);
  if (typeInfo == (ComplexTypeInfo *)0x0) {
    local_74 = 0;
  }
  else {
    local_74 = ComplexTypeInfo::getScopeDefined(typeInfo);
    XercesGroupInfo::setCheckElementConsistency(fromGroup,false);
  }
  elemDecl = (SchemaElementDecl *)0x0;
  do {
    if (pSVar3 <= elemDecl) {
      return;
    }
    this_00 = XercesGroupInfo::elementAt(fromGroup,(XMLSize_t)elemDecl);
    if (typeInfo == (ComplexTypeInfo *)0x0) {
LAB_0043fb31:
      if (toGroup != (XercesGroupInfo *)0x0) {
        XercesGroupInfo::addElement(toGroup,this_00);
      }
    }
    else {
      newEnclosingScope = SchemaElementDecl::getEnclosingScope(this_00);
      if (newEnclosingScope == 0xfffffffe) {
LAB_0043fb24:
        ComplexTypeInfo::addElement(typeInfo,this_00);
        goto LAB_0043fb31;
      }
      uVar1 = XMLElementDecl::getURI(&this_00->super_XMLElementDecl);
      text1 = XMLElementDecl::getBaseName(&this_00->super_XMLElementDecl);
      iVar2 = (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                        (this->fSchemaGrammar,(ulong)uVar1,text1,0,(ulong)local_74);
      this_01 = (SchemaElementDecl *)CONCAT44(extraout_var,iVar2);
      if (this_01 == (SchemaElementDecl *)0x0) {
        SchemaElementDecl::setEnclosingScope(this_00,local_74);
        SchemaGrammar::putGroupElemDecl(this->fSchemaGrammar,&this_00->super_XMLElementDecl);
        SchemaElementDecl::setEnclosingScope(this_00,newEnclosingScope);
        goto LAB_0043fb24;
      }
      pCVar4 = SchemaElementDecl::getComplexTypeInfo(this_00);
      pCVar5 = SchemaElementDecl::getComplexTypeInfo(this_01);
      if (pCVar4 == pCVar5) {
        pDVar6 = SchemaElementDecl::getDatatypeValidator(this_00);
        pDVar7 = SchemaElementDecl::getDatatypeValidator(this_01);
        if (pDVar6 != pDVar7) goto LAB_0043fac6;
      }
      else {
LAB_0043fac6:
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x43,text1,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
    elemDecl = (SchemaElementDecl *)
               ((long)&(elemDecl->super_XMLElementDecl).super_XSerializable._vptr_XSerializable + 1)
    ;
  } while( true );
}

Assistant:

void TraverseSchema::copyGroupElements(const DOMElement* const elem,
                                       XercesGroupInfo* const fromGroup,
                                       XercesGroupInfo* const toGroup,
                                       ComplexTypeInfo* const typeInfo) {

    XMLSize_t elemCount = fromGroup->elementCount();
    int newScope = (typeInfo) ? typeInfo->getScopeDefined() : 0;

    if (typeInfo)
        fromGroup->setCheckElementConsistency(false);

    for (XMLSize_t i = 0; i < elemCount; i++) {

        SchemaElementDecl*       elemDecl = fromGroup->elementAt(i);

        if (typeInfo) {

            unsigned int elemScope = elemDecl->getEnclosingScope();

            if (elemScope != Grammar::TOP_LEVEL_SCOPE) {

                int                      elemURI = elemDecl->getURI();
                const XMLCh*             localPart = elemDecl->getBaseName();
                const SchemaElementDecl* other = (SchemaElementDecl*)
                        fSchemaGrammar->getElemDecl(elemURI, localPart, 0, newScope);

                if (other) {

                    if (elemDecl->getComplexTypeInfo() != other->getComplexTypeInfo()
                        || elemDecl->getDatatypeValidator() != other->getDatatypeValidator()) {
                       reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateElementDeclaration, localPart);
                    }

                    continue;
                }

                elemDecl->setEnclosingScope(newScope);
                fSchemaGrammar->putGroupElemDecl(elemDecl);
                elemDecl->setEnclosingScope(elemScope);
            }

            typeInfo->addElement(elemDecl);
        }

        if (toGroup) {
            toGroup->addElement(elemDecl);
        }
    }
}